

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

string * minja::error_location_suffix(string *__return_storage_ptr__,string *source,size_t pos)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  size_type sVar1;
  char cVar2;
  size_t line;
  difference_type dVar3;
  ostream *poVar4;
  string local_1d8;
  anon_class_8_1_6bb45959 get_line;
  ostringstream out;
  undefined7 uStack_1a7;
  undefined1 local_198 [360];
  
  __first._M_current = (source->_M_dataplus)._M_p;
  sVar1 = source->_M_string_length;
  out = (ostringstream)0xa;
  get_line.source = source;
  line = std::
         __count_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                   (__first,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )(__first._M_current + pos),(_Iter_equals_val<const_char>)&out);
  _out = (undefined1 *)CONCAT71(uStack_1a7,10);
  dVar3 = std::
          __count_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (__first,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )(__first._M_current + sVar1),(_Iter_equals_val<const_char>)&out);
  _out = local_198;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&out,__first._M_current,__first._M_current + pos);
  cVar2 = std::__cxx11::string::rfind((char)(string *)&out,10);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
  poVar4 = std::operator<<((ostream *)&out," at row ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  poVar4 = std::operator<<(poVar4,", column ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4,":\n");
  if (0 < (long)line) {
    error_location_suffix(std::__cxx11::string_const&,unsigned_long)::$_0::operator()[abi_cxx11_
              (&local_1d8,&get_line,line);
    poVar4 = std::operator<<((ostream *)&out,(string *)&local_1d8);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  error_location_suffix(std::__cxx11::string_const&,unsigned_long)::$_0::operator()[abi_cxx11_
            (&local_1d8,&get_line,line + 1);
  poVar4 = std::operator<<((ostream *)&out,(string *)&local_1d8);
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string((string *)&local_1d8);
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_1d8,((char)pos - cVar2) + -1);
  poVar4 = std::operator<<((ostream *)&out,(string *)&local_1d8);
  std::operator<<(poVar4,"^\n");
  std::__cxx11::string::~string((string *)&local_1d8);
  if ((long)line < dVar3) {
    error_location_suffix(std::__cxx11::string_const&,unsigned_long)::$_0::operator()[abi_cxx11_
              (&local_1d8,&get_line,line + 2);
    poVar4 = std::operator<<((ostream *)&out,(string *)&local_1d8);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

static std::string error_location_suffix(const std::string & source, size_t pos) {
  auto get_line = [&](size_t line) {
    auto start = source.begin();
    for (size_t i = 1; i < line; ++i) {
      start = std::find(start, source.end(), '\n') + 1;
    }
    auto end = std::find(start, source.end(), '\n');
    return std::string(start, end);
  };
  auto start = source.begin();
  auto end = source.end();
  auto it = start + pos;
  auto line = std::count(start, it, '\n') + 1;
  auto max_line = std::count(start, end, '\n') + 1;
  auto col = pos - std::string(start, it).rfind('\n');
  std::ostringstream out;
  out << " at row " << line << ", column " << col << ":\n";
  if (line > 1) out << get_line(line - 1) << "\n";
  out << get_line(line) << "\n";
  out << std::string(col - 1, ' ') << "^\n";
  if (line < max_line) out << get_line(line + 1) << "\n";

  return out.str();
}